

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Op.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::StringOp::StringOp(StringOp *this,opType type,XMLCh *literal,MemoryManager *manager)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  XMLCh *__dest;
  
  (this->super_Op).fMemoryManager = manager;
  (this->super_Op).fOpType = type;
  (this->super_Op).fNextOp = (Op *)0x0;
  (this->super_Op)._vptr_Op = (_func_int **)&PTR__StringOp_0040bb90;
  if (literal == (XMLCh *)0x0) {
    __dest = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)literal + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar2);
    memcpy(__dest,literal,__n);
  }
  this->fLiteral = __dest;
  return;
}

Assistant:

StringOp::StringOp(const Op::opType type, const XMLCh* const literal
                   , MemoryManager* const manager)
    : Op (type, manager)
      , fLiteral(XMLString::replicate(literal, manager)) {

}